

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

uint8_t fio_cluster_on_shutdown(intptr_t uuid,fio_protocol_s *pr_)

{
  _func_uint8_t_intptr_t_fio_protocol_s_ptr *p_Var1;
  fio_str_info_s ch;
  fio_str_info_s data;
  fio_msg_internal_s *pfVar2;
  
  p_Var1 = pr_[1].on_shutdown;
  ch.data = (char *)0x0;
  ch.capa = 0;
  ch.len = 0;
  data.data = (char *)0x0;
  data.capa = 0;
  data.len = 0;
  pfVar2 = fio_msg_internal_create(0,8,ch,data,'\0','\x01');
  (*p_Var1)((intptr_t)pfVar2,(fio_protocol_s *)0xffffffffffffffff);
  return 0xff;
}

Assistant:

static uint8_t fio_cluster_on_shutdown(intptr_t uuid, fio_protocol_s *pr_) {
  cluster_pr_s *p = (cluster_pr_s *)pr_;
  p->sender(fio_msg_internal_create(0, FIO_CLUSTER_MSG_SHUTDOWN,
                                    (fio_str_info_s){.len = 0},
                                    (fio_str_info_s){.len = 0}, 0, 1),
            -1);
  return 255;
  (void)pr_;
  (void)uuid;
}